

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O0

void __thiscall
QuickImpl::ProcessAck(QuickImpl *this,string *ip,uint16_t port,uint8_t *data,int16_t data_len)

{
  bool bVar1;
  pointer ppVar2;
  pointer this_00;
  Location local_60;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
  local_48;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
  local_40;
  iterator iter;
  QuickAck *ack;
  int16_t data_len_local;
  uint8_t *data_local;
  uint16_t port_local;
  string *ip_local;
  QuickImpl *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
               )data;
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>_>
       ::find(&this->_connections,(key_type *)(data + 1));
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>_>
       ::end(&this->_connections);
  bVar1 = std::__detail::operator==(&local_40,&local_48);
  if (bVar1) {
    dd::Location::Location
              (&local_60,"ProcessAck",
               "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc"
               ,0x130);
    LogWrapper::Write(&g_quic_log,&local_60,2,anon_var_dwarf_6db69,
                      (ulong)*(uint *)((long)iter.
                                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
                                             ._M_cur + 1));
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false,_false>
                           *)&local_40);
    this_00 = std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>::operator->
                        (&ppVar2->second);
    QuickConnection::OnAck(this_00,ip,port,data,data_len,this->_received_time_microseconds);
  }
  return;
}

Assistant:

void QuickImpl::ProcessAck(const std::string &ip, uint16_t port, const uint8_t* data, int16_t data_len)
{
	QuickAck *ack = (QuickAck*)data;
	auto iter = _connections.find(ack->session_id);
	if (iter == _connections.end()) {
		g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "�Ҳ�����Ӧ��session id %u, �޷������� ack", ack->session_id);
		return;
	}
	iter->second->OnAck(ip, port, data, data_len, _received_time_microseconds);
}